

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O2

void __thiscall CEPlanet::Update_SOFA(CEPlanet *this,double new_jd)

{
  double dVar1;
  int i;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  int j;
  long lVar5;
  string *psVar6;
  double *pdVar7;
  double *pdVar8;
  double tdb2;
  double tdb1;
  double pvh [2] [3];
  double mjd;
  double pvb [2] [3];
  double pvhe [2] [3];
  allocator<double> local_e1;
  double local_e0;
  double local_d8;
  double local_d0;
  string local_c8;
  double local_90;
  double local_88 [3];
  double local_70 [3];
  double local_58 [6];
  
  local_d0 = 0.0;
  local_d8 = 0.0;
  local_e0 = new_jd;
  local_90 = CEDate::GetMJD2JDFactor();
  local_90 = local_e0 - local_90;
  CEDate::UTC2TDB(&local_90,&local_d0,&local_d8);
  pdVar7 = local_58;
  pdVar8 = local_88;
  iVar2 = iauEpv00(local_d0,local_d8,pdVar7,pdVar8);
  dVar1 = this->sofa_planet_id_;
  if ((dVar1 != 3.5) || (NAN(dVar1))) {
    psVar6 = &local_c8;
    iVar2 = iauPlan94(local_d0,local_d8,(int)dVar1,psVar6);
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        pdVar8[lVar5] = (pdVar8[lVar5] - pdVar7[lVar5]) + (double)(&psVar6->_M_dataplus)[lVar5]._M_p
        ;
      }
      psVar6 = (string *)((psVar6->field_2)._M_local_buf + 8);
      pdVar8 = pdVar8 + 3;
      pdVar7 = pdVar7 + 3;
    }
  }
  if (iVar2 == 0) {
    std::allocator<double>::allocator(&local_e1);
    std::vector<double,std::allocator<double>>::vector<double*,void>
              ((vector<double,std::allocator<double>> *)&local_c8,local_88,local_70,&local_e1);
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->pos_icrs_,(vector<double,_std::allocator<double>_> *)&local_c8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&local_c8);
    __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_e1);
    std::allocator<double>::allocator(&local_e1);
    std::vector<double,std::allocator<double>>::vector<double*,void>
              ((vector<double,std::allocator<double>> *)&local_c8,local_70,local_58,&local_e1);
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->vel_icrs_,(vector<double,_std::allocator<double>_> *)&local_c8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&local_c8);
    __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_e1);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"[ERROR] failed to compute planet positions for "
                            );
    CEBody::Name_abi_cxx11_(&local_c8,&this->super_CEBody);
    poVar4 = std::operator<<(poVar4,(string *)&local_c8);
    poVar4 = std::operator<<(poVar4,". ErrCode=");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

void CEPlanet::Update_SOFA(double new_jd) const
{
    // Compute the TDB based on supplied jd
    double tdb1(0.0);
    double tdb2(0.0);
    double mjd = new_jd - CEDate::GetMJD2JDFactor();
    CEDate::UTC2TDB(mjd, &tdb1, &tdb2);

    // Compute the Earth relative corrections
    double pvb[2][3];
    double pvhe[2][3];
    int err = iauEpv00(tdb1, tdb2, pvhe, pvb);

    // If this isn't the earth, compute the planet's heliocentric position
    if (sofa_planet_id_ != 3.5) {
        double pvh[2][3];
        err = iauPlan94(tdb1, tdb2, sofa_planet_id_, pvh) ;

        // Compute the corrected factors for heliocentric -> barycentric as
        //      bary_planet = helio_planet + (bary_earth - helio_earth)
        for (int i=0; i<2; i++) {
            for (int j=0; j<3; j++) {
                pvb[i][j] = pvh[i][j] + (pvb[i][j] - pvhe[i][j]);
            }
        }
    }
    
    // If the returned error code is zero, compute the values
    if (err == 0) {
        // position
        pos_icrs_ = std::vector<double>(pvb[0], pvb[0]+3);
    
        // velocity
        vel_icrs_ = std::vector<double>(pvb[1], pvb[1]+3);
    } else {
        std::cerr << "[ERROR] failed to compute planet positions for " << Name() << ". ErrCode=" << err << "\n" ;
    }
}